

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeBase * ApplyArraySizesToType(ExpressionContext *ctx,TypeBase *type,SynBase *sizes)

{
  bool bVar1;
  ExprBase *pEVar2;
  TypeArray *pTVar3;
  TypeBase *pTVar4;
  TypeUnsizedArray *pTVar5;
  uint uVar6;
  char *pcVar7;
  SynBase *syntax;
  TypeArray *pTVar8;
  
  syntax = sizes;
  if ((sizes != (SynBase *)0x0) && (syntax = (SynBase *)0x0, sizes->typeID != 3)) {
    syntax = sizes;
  }
  if (sizes->next != (SynBase *)0x0) {
    type = ApplyArraySizesToType(ctx,type,sizes->next);
  }
  if ((type == (TypeBase *)0x0) || (type->typeID != 0xe)) {
    if (type == ctx->typeVoid) {
      pcVar7 = "ERROR: cannot specify array size for void";
      syntax = sizes;
    }
    else if (syntax == (SynBase *)0x0) {
      if (type->size < 0x10000) {
        pTVar5 = ExpressionContext::GetUnsizedArrayType(ctx,type);
        return (TypeBase *)pTVar5;
      }
      pcVar7 = "ERROR: array element size cannot exceed 65535 bytes";
      syntax = sizes;
    }
    else {
      pEVar2 = AnalyzeExpression(ctx,syntax);
      pEVar2 = CreateCast(ctx,syntax,pEVar2,ctx->typeLong,false);
      pTVar3 = (TypeArray *)anon_unknown.dwarf_9fd58::EvaluateExpression(ctx,syntax,pEVar2);
      if ((pTVar3 == (TypeArray *)0x0) || (pTVar8 = pTVar3, (pTVar3->super_TypeBase).typeID != 6)) {
        pTVar8 = (TypeArray *)0x0;
      }
      if (pTVar8 != (TypeArray *)0x0) {
        if ((pTVar8->super_TypeBase).size < 1) {
          pcVar7 = "ERROR: array size can\'t be negative or zero";
          goto LAB_0015741a;
        }
        if ((type == (TypeBase *)0x0) || (pTVar4 = type, type->typeID != 0x18)) {
          pTVar4 = (TypeBase *)0x0;
        }
        if (pTVar4 != (TypeBase *)0x0) {
          if (*(char *)&pTVar4[3]._vptr_TypeBase == '\0') {
            uVar6 = *(int *)&(type->name).end - (int)(type->name).begin;
            pcVar7 = "ERROR: type \'%.*s\' is not fully defined";
LAB_00157447:
            anon_unknown.dwarf_9fd58::Stop(ctx,syntax,pcVar7,(ulong)uVar6);
          }
          if (*(char *)((long)&pTVar4[3]._vptr_TypeBase + 2) == '\x01') {
            uVar6 = *(int *)&(type->name).end - (int)(type->name).begin;
            pcVar7 = 
            "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
            ;
            goto LAB_00157447;
          }
        }
        if (0xffff < type->size) {
          pcVar7 = "ERROR: array element size cannot exceed 65535 bytes";
          goto LAB_0015741a;
        }
        bVar1 = AssertResolvableType(ctx,syntax,type,true);
        if (bVar1) {
          pTVar3 = ExpressionContext::GetArrayType(ctx,type,(pTVar8->super_TypeBase).size);
        }
        else {
          pTVar3 = (TypeArray *)ExpressionContext::GetErrorType(ctx);
        }
      }
      if (pTVar8 != (TypeArray *)0x0) {
        return &pTVar3->super_TypeBase;
      }
      pcVar7 = "ERROR: array size cannot be evaluated";
    }
  }
  else {
    if (syntax == (SynBase *)0x0) {
      return &ctx->typeAutoArray->super_TypeBase;
    }
    pcVar7 = "ERROR: cannot specify array size for auto";
  }
LAB_0015741a:
  anon_unknown.dwarf_9fd58::Stop(ctx,syntax,pcVar7);
}

Assistant:

TypeBase* ApplyArraySizesToType(ExpressionContext &ctx, TypeBase *type, SynBase *sizes)
{
	SynBase *size = sizes;

	if(isType<SynNothing>(size))
		size = NULL;

	if(sizes->next)
		type = ApplyArraySizesToType(ctx, type, sizes->next);

	if(isType<TypeAuto>(type))
	{
		if(size)
			Stop(ctx, size, "ERROR: cannot specify array size for auto");

		return ctx.typeAutoArray;
	}

	if(type == ctx.typeVoid)
		Stop(ctx, sizes, "ERROR: cannot specify array size for void");

	if(!size)
	{
		if(type->size >= 64 * 1024)
			Stop(ctx, sizes, "ERROR: array element size cannot exceed 65535 bytes");

		return ctx.GetUnsizedArrayType(type);
	}

	ExprBase *sizeValue = AnalyzeExpression(ctx, size);

	if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, size, CreateCast(ctx, size, sizeValue, ctx.typeLong, false))))
	{
		if(number->value <= 0)
			Stop(ctx, size, "ERROR: array size can't be negative or zero");

		if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			if(!typeClass->completed)
				Stop(ctx, size, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));

			if(typeClass->hasFinalizer)
				Stop(ctx, size, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(type->name));
		}

		if(type->size >= 64 * 1024)
			Stop(ctx, size, "ERROR: array element size cannot exceed 65535 bytes");

		if(!AssertResolvableType(ctx, size, type, true))
			return ctx.GetErrorType();

		return ctx.GetArrayType(type, number->value);
	}

	Stop(ctx, size, "ERROR: array size cannot be evaluated");

	return NULL;
}